

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::LSTM_x86_avx::forward
          (LSTM_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  int iVar1;
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  int *piVar2;
  uint uVar3;
  int iVar4;
  _func_int *p_Var5;
  ulong uVar6;
  pointer pMVar7;
  size_t sVar8;
  void *pvVar9;
  int _h_00;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar10;
  void *__dest;
  bool bVar11;
  Mat m;
  Mat local_368;
  Mat local_318;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2d0;
  Mat m_3;
  Mat m_6;
  Mat m_2;
  Mat m_1;
  Mat m_5;
  Mat local_158;
  Mat m_4;
  Mat m_9;
  Mat m_8;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  _h = bottom_blob->h;
  iVar1 = *(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x40 + (long)&(this->weight_hc_data_packed).data);
  local_318.cstep = 0;
  local_318.data = (void *)0x0;
  local_318.refcount._0_4_ = 0;
  local_318.refcount._4_4_ = 0;
  local_318.elemsize._0_4_ = 0;
  local_318.elemsize._4_4_ = 0;
  local_318.elempack = 0;
  local_318.allocator = (Allocator *)0x0;
  local_318.dims = 0;
  local_318.w = 0;
  local_318.h = 0;
  local_318.d = 0;
  local_318.c = 0;
  local_368.cstep = 0;
  local_368.data = (void *)0x0;
  local_368.refcount._0_4_ = 0;
  local_368.refcount._4_4_ = 0;
  local_368.elemsize._0_4_ = 0;
  local_368.elemsize._4_4_ = 0;
  local_368.elempack = 0;
  local_368.allocator = (Allocator *)0x0;
  local_368.dims = 0;
  local_368.w = 0;
  local_368.h = 0;
  local_368.d = 0;
  local_368.c = 0;
  pvVar9 = (void *)((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start);
  _allocator = (&opt->blob_allocator)[pvVar9 != (void *)0xd8];
  local_2d0 = top_blobs;
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0xd8) {
    Mat::clone(&m,(__fn *)(bottom_blob + 1),_allocator,(int)opt,pvVar9);
    pvVar10 = local_2d0;
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_318.allocator == (Allocator *)0x0) {
          if (local_318.data != (void *)0x0) {
            free(local_318.data);
          }
        }
        else {
          (*(local_318.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_318.data = m.data;
    local_318.refcount._0_4_ = m.refcount._0_4_;
    local_318.refcount._4_4_ = m.refcount._4_4_;
    local_318.elemsize._0_4_ = (undefined4)m.elemsize;
    local_318.elemsize._4_4_ = m.elemsize._4_4_;
    local_318.elempack = m.elempack;
    local_318.allocator = m.allocator;
    local_318.dims = m.dims;
    local_318.w = m.w;
    local_318.h = m.h;
    local_318.d = m.d;
    local_318.c = m.c;
    local_318.cstep = m.cstep;
    sVar8 = m.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    Mat::clone(&m,(__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 2),_allocator,(int)sVar8,
               pvVar9);
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_368.allocator == (Allocator *)0x0) {
          if (local_368.data != (void *)0x0) {
            free(local_368.data);
          }
        }
        else {
          (*(local_368.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_368.data = m.data;
    local_368.refcount._0_4_ = m.refcount._0_4_;
    local_368.refcount._4_4_ = m.refcount._4_4_;
    local_368.elemsize._0_4_ = (undefined4)m.elemsize;
    local_368.elemsize._4_4_ = m.elemsize._4_4_;
    local_368.elempack = m.elempack;
    local_368.allocator = m.allocator;
    local_368.dims = m.dims;
    local_368.w = m.w;
    local_368.h = m.h;
    local_368.d = m.d;
    local_368.c = m.c;
    local_368.cstep = m.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    _h_00 = (iVar1 == 2) + 1;
    Mat::create(&local_318,
                *(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x38 +
                        (long)&(this->weight_hc_data_packed).data),_h_00,4,_allocator);
    iVar4 = -100;
    if ((local_318.data == (void *)0x0) || (local_318.cstep * (long)local_318.c == 0))
    goto LAB_00375dda;
    uVar3 = (int)local_318.cstep * local_318.c;
    if (0 < (int)uVar3) {
      memset(local_318.data,0,(ulong)uVar3 << 2);
    }
    Mat::create(&local_368,
                *(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x44 +
                        (long)&(this->weight_hc_data_packed).data),_h_00,4,_allocator);
    pvVar10 = local_2d0;
    if ((local_368.data == (void *)0x0) || (local_368.cstep * (long)local_368.c == 0))
    goto LAB_00375dda;
    uVar3 = (int)local_368.cstep * local_368.c;
    if (0 < (int)uVar3) {
      memset(local_368.data,0,(ulong)uVar3 << 2);
    }
  }
  this_00 = (pvVar10->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,*(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x38 +
                              (long)&(this->weight_hc_data_packed).data) << (iVar1 == 2),_h,4,
              opt->blob_allocator);
  iVar4 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    p_Var5 = this->_vptr_LSTM_x86_avx[-3];
    uVar3 = *(uint *)(p_Var5 + 0x40 + (long)&(this->weight_hc_data_packed).data);
    if (uVar3 < 2) {
      m.w = (this->weight_xc_data_packed).w;
      m.h = (this->weight_xc_data_packed).h;
      m.c = (this->weight_xc_data_packed).d;
      m.data = (this->weight_xc_data_packed).data;
      uVar6 = (this->weight_xc_data_packed).elemsize;
      m.elempack = (this->weight_xc_data_packed).elempack;
      m.allocator = (this->weight_xc_data_packed).allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar6;
      m.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
      m.d = 1;
      iVar1 = (this->weight_xc_data_packed).dims;
      m.dims = iVar1 + -1;
      m.cstep = (uVar6 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar6;
      if (iVar1 == 4) {
        m.cstep = (long)m.h * (long)m.w;
      }
      m_1.w = (this->bias_c_data_packed).w;
      m_1.h = (this->bias_c_data_packed).h;
      m_1.data = (this->bias_c_data_packed).data;
      uVar6 = (this->bias_c_data_packed).elemsize;
      m_1.elempack = (this->bias_c_data_packed).elempack;
      m_1.allocator = (this->bias_c_data_packed).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar6;
      m_1.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
      m_1.c = (this->bias_c_data_packed).d;
      m_1.d = 1;
      iVar1 = (this->bias_c_data_packed).dims;
      m_1.dims = iVar1 + -1;
      m_1.cstep = (uVar6 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar6;
      if (iVar1 == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.w = (this->weight_hc_data_packed).w;
      m_2.h = (this->weight_hc_data_packed).h;
      m_2.c = (this->weight_hc_data_packed).d;
      m_2.data = (this->weight_hc_data_packed).data;
      m_2.elemsize = (this->weight_hc_data_packed).elemsize;
      m_2.elempack = (this->weight_hc_data_packed).elempack;
      m_2.allocator = (this->weight_hc_data_packed).allocator;
      m_2.refcount = (int *)0x0;
      m_2.d = 1;
      sVar8 = (long)m_2.h * (long)m_2.w;
      iVar1 = (this->weight_hc_data_packed).dims;
      m_2.dims = iVar1 + -1;
      m_2.cstep = (m_2.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
      if (iVar1 == 4) {
        m_2.cstep = sVar8;
      }
      if (*(int *)(p_Var5 + 0x38 + (long)&(this->weight_hc_data_packed).data) ==
          *(int *)(p_Var5 + 0x44 + (long)&(this->weight_hc_data_packed).data)) {
        m_3.cstep = 0;
        m_3.data = (void *)0x0;
        m_3.elemsize._0_4_ = 0;
        m_3.elemsize._4_4_ = 0;
        m_3.elempack = 0;
        m_3.allocator = (Allocator *)0x0;
        m_3.dims = 0;
        m_3.w = 0;
        m_3.h = 0;
        m_3.d = 0;
        m_3.c = 0;
      }
      else {
        m_3.w = *(int *)(&this->field_0x1e4 + (long)p_Var5);
        m_3.h = *(int *)(&this->field_0x1e8 + (long)p_Var5);
        m_3.c = *(int *)(&this->field_0x1ec + (long)p_Var5);
        m_3.data = *(void **)(&this->field_0x1b8 + (long)p_Var5);
        uVar6 = *(ulong *)(&this->field_0x1c8 + (long)p_Var5);
        m_3.elempack = *(int *)(&this->field_0x1d0 + (long)p_Var5);
        m_3.allocator = *(Allocator **)(&this->field_0x1d8 + (long)p_Var5);
        m_3.elemsize._0_4_ = (undefined4)uVar6;
        m_3.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
        m_3.d = 1;
        m_3.dims = *(int *)(&this->field_0x1e0 + (long)p_Var5) + -1;
        m_3.cstep = (uVar6 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar6;
        if (*(int *)(&this->field_0x1e0 + (long)p_Var5) == 4) {
          m_3.cstep = (long)m_3.h * (long)m_3.w;
        }
      }
      m_3.refcount._4_4_ = 0;
      m_3.refcount._0_4_ = 0;
      iVar4 = lstm(bottom_blob,this_00,uVar3,&m,&m_1,&m_2,&m_3,&local_318,&local_368,opt);
      if (iVar4 != 0) goto LAB_00375dda;
      p_Var5 = this->_vptr_LSTM_x86_avx[-3];
      uVar3 = *(uint *)(p_Var5 + 0x40 + (long)&(this->weight_hc_data_packed).data);
    }
    if (uVar3 == 2) {
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.allocator = (Allocator *)0x0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      Mat::create(&m,*(int *)(p_Var5 + 0x38 + (long)&(this->weight_hc_data_packed).data),_h,4,
                  opt->workspace_allocator);
      iVar4 = -100;
      if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
        bVar11 = false;
      }
      else {
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.allocator = (Allocator *)0x0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
        Mat::create(&m_1,*(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x38 +
                                 (long)&(this->weight_hc_data_packed).data),_h,4,
                    opt->workspace_allocator);
        iVar4 = -100;
        if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
          bVar11 = false;
        }
        else {
          m_2.cstep = (size_t)local_318.w;
          m_2.elemsize = CONCAT44(local_318.elemsize._4_4_,(undefined4)local_318.elemsize);
          m_2.data = local_318.data;
          m_2.refcount = (int *)0x0;
          m_2.elempack = local_318.elempack;
          m_2.allocator = local_318.allocator;
          m_2.dims = 2;
          m_2.w = local_318.w;
          m_2.h = 1;
          m_2.d = 1;
          m_2.c = 1;
          m_3.cstep = (size_t)local_368.w;
          m_3.data = local_368.data;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = (undefined4)local_368.elemsize;
          m_3.elemsize._4_4_ = local_368.elemsize._4_4_;
          m_3.elempack = local_368.elempack;
          m_3.allocator = local_368.allocator;
          m_3.dims = 2;
          m_3.w = local_368.w;
          m_3.h = 1;
          m_3.d = 1;
          m_3.c = 1;
          local_158.w = (this->weight_xc_data_packed).w;
          local_158.h = (this->weight_xc_data_packed).h;
          local_158.c = (this->weight_xc_data_packed).d;
          local_158.data = (this->weight_xc_data_packed).data;
          local_158.elemsize = (this->weight_xc_data_packed).elemsize;
          local_158.elempack = (this->weight_xc_data_packed).elempack;
          local_158.allocator = (this->weight_xc_data_packed).allocator;
          local_158.refcount = (int *)0x0;
          local_158.d = 1;
          uVar6 = (long)local_158.h * (long)local_158.w;
          iVar1 = (this->weight_xc_data_packed).dims;
          local_158.dims = iVar1 + -1;
          local_158.cstep =
               (local_158.elemsize * uVar6 + 0xf & 0xfffffffffffffff0) / local_158.elemsize;
          if (iVar1 == 4) {
            local_158.cstep = uVar6;
          }
          m_4.w = (this->bias_c_data_packed).w;
          m_4.h = (this->bias_c_data_packed).h;
          m_4.c = (this->bias_c_data_packed).d;
          m_4.data = (this->bias_c_data_packed).data;
          m_4.elemsize = (this->bias_c_data_packed).elemsize;
          m_4.elempack = (this->bias_c_data_packed).elempack;
          m_4.allocator = (this->bias_c_data_packed).allocator;
          m_4.refcount = (int *)0x0;
          m_4.d = 1;
          sVar8 = (long)m_4.h * (long)m_4.w;
          iVar1 = (this->bias_c_data_packed).dims;
          m_4.dims = iVar1 + -1;
          m_4.cstep = (m_4.elemsize * sVar8 + 0xf & 0xfffffffffffffff0) / m_4.elemsize;
          if (iVar1 == 4) {
            m_4.cstep = sVar8;
          }
          m_5.w = (this->weight_hc_data_packed).w;
          m_5.h = (this->weight_hc_data_packed).h;
          m_5.c = (this->weight_hc_data_packed).d;
          m_5.data = (this->weight_hc_data_packed).data;
          m_5.elemsize = (this->weight_hc_data_packed).elemsize;
          m_5.elempack = (this->weight_hc_data_packed).elempack;
          m_5.allocator = (this->weight_hc_data_packed).allocator;
          m_5.refcount = (int *)0x0;
          m_5.d = 1;
          iVar1 = (this->weight_hc_data_packed).dims;
          m_5.dims = iVar1 + -1;
          m_5.cstep = (m_5.elemsize * (long)m_5.h * (long)m_5.w + 0xf & 0xfffffffffffffff0) /
                      m_5.elemsize;
          if (iVar1 == 4) {
            m_5.cstep = (long)m_5.h * (long)m_5.w;
          }
          p_Var5 = this->_vptr_LSTM_x86_avx[-3];
          if (*(int *)(p_Var5 + 0x38 + (long)&(this->weight_hc_data_packed).data) ==
              *(int *)(p_Var5 + 0x44 + (long)&(this->weight_hc_data_packed).data)) {
            m_6.cstep = 0;
            m_6.data = (void *)0x0;
            m_6.elemsize._0_4_ = 0;
            m_6.elemsize._4_4_ = 0;
            m_6.elempack = 0;
            m_6.allocator = (Allocator *)0x0;
            m_6.dims = 0;
            m_6.w = 0;
            m_6.h = 0;
            m_6.d = 0;
            m_6.c = 0;
          }
          else {
            m_6.w = *(int *)(&this->field_0x1e4 + (long)p_Var5);
            m_6.h = *(int *)(&this->field_0x1e8 + (long)p_Var5);
            m_6.data = *(void **)(&this->field_0x1b8 + (long)p_Var5);
            uVar6 = *(ulong *)(&this->field_0x1c8 + (long)p_Var5);
            m_6.elempack = *(int *)(&this->field_0x1d0 + (long)p_Var5);
            m_6.allocator = *(Allocator **)(&this->field_0x1d8 + (long)p_Var5);
            m_6.elemsize._0_4_ = (undefined4)uVar6;
            m_6.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_6.c = *(int *)(&this->field_0x1ec + (long)p_Var5);
            m_6.d = 1;
            m_6.dims = *(int *)(&this->field_0x1e0 + (long)p_Var5) + -1;
            m_6.cstep = (uVar6 * (long)m_6.h * (long)m_6.w + 0xf & 0xfffffffffffffff0) / uVar6;
            if (*(int *)(&this->field_0x1e0 + (long)p_Var5) == 4) {
              m_6.cstep = (long)m_6.h * (long)m_6.w;
            }
          }
          m_6.refcount._4_4_ = 0;
          m_6.refcount._0_4_ = 0;
          iVar4 = lstm(bottom_blob,&m,0,&local_158,&m_4,&m_5,&m_6,&m_2,&m_3,opt);
          if (iVar4 == 0) {
            local_158.cstep = (size_t)local_318.w;
            local_158.elemsize = CONCAT44(local_318.elemsize._4_4_,(undefined4)local_318.elemsize);
            local_158.data = (void *)(local_158.elemsize * local_158.cstep + (long)local_318.data);
            local_158.refcount = (int *)0x0;
            local_158.elempack = local_318.elempack;
            local_158.allocator = local_318.allocator;
            local_158.dims = 2;
            local_158.w = local_318.w;
            local_158.h = 1;
            local_158.d = 1;
            local_158.c = 1;
            m_4.cstep = (size_t)local_368.w;
            m_4.elemsize = CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize);
            m_4.data = (void *)(m_4.elemsize * m_4.cstep + (long)local_368.data);
            m_4.refcount = (int *)0x0;
            m_4.elempack = local_368.elempack;
            m_4.allocator = local_368.allocator;
            m_4.dims = 2;
            m_4.w = local_368.w;
            m_4.h = 1;
            m_4.d = 1;
            m_4.c = 1;
            m_5.w = (this->weight_xc_data_packed).w;
            m_5.h = (this->weight_xc_data_packed).h;
            m_5.c = (this->weight_xc_data_packed).d;
            m_5.elemsize = (this->weight_xc_data_packed).elemsize;
            m_5.data = (void *)((this->weight_xc_data_packed).cstep * m_5.elemsize +
                               (long)(this->weight_xc_data_packed).data);
            m_5.elempack = (this->weight_xc_data_packed).elempack;
            m_5.allocator = (this->weight_xc_data_packed).allocator;
            m_5.refcount = (int *)0x0;
            m_5.d = 1;
            iVar1 = (this->weight_xc_data_packed).dims;
            m_5.dims = iVar1 + -1;
            m_5.cstep = (m_5.elemsize * (long)m_5.h * (long)m_5.w + 0xf & 0xfffffffffffffff0) /
                        m_5.elemsize;
            if (iVar1 == 4) {
              m_5.cstep = (long)m_5.h * (long)m_5.w;
            }
            m_6.w = (this->bias_c_data_packed).w;
            m_6.h = (this->bias_c_data_packed).h;
            uVar6 = (this->bias_c_data_packed).elemsize;
            m_6.data = (void *)((this->bias_c_data_packed).cstep * uVar6 +
                               (long)(this->bias_c_data_packed).data);
            m_6.elempack = (this->bias_c_data_packed).elempack;
            m_6.allocator = (this->bias_c_data_packed).allocator;
            m_6.refcount._0_4_ = 0;
            m_6.refcount._4_4_ = 0;
            m_6.elemsize._0_4_ = (undefined4)uVar6;
            m_6.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_6.c = (this->bias_c_data_packed).d;
            m_6.d = 1;
            iVar1 = (this->bias_c_data_packed).dims;
            m_6.dims = iVar1 + -1;
            m_6.cstep = (uVar6 * (long)m_6.h * (long)m_6.w + 0xf & 0xfffffffffffffff0) / uVar6;
            if (iVar1 == 4) {
              m_6.cstep = (long)m_6.h * (long)m_6.w;
            }
            m_8.w = (this->weight_hc_data_packed).w;
            m_8.h = (this->weight_hc_data_packed).h;
            m_8.c = (this->weight_hc_data_packed).d;
            m_8.elemsize = (this->weight_hc_data_packed).elemsize;
            m_8.data = (void *)((this->weight_hc_data_packed).cstep * m_8.elemsize +
                               (long)(this->weight_hc_data_packed).data);
            m_8.elempack = (this->weight_hc_data_packed).elempack;
            m_8.allocator = (this->weight_hc_data_packed).allocator;
            m_8.refcount = (int *)0x0;
            m_8.d = 1;
            iVar1 = (this->weight_hc_data_packed).dims;
            m_8.dims = iVar1 + -1;
            m_8.cstep = (m_8.elemsize * (long)m_8.h * (long)m_8.w + 0xf & 0xfffffffffffffff0) /
                        m_8.elemsize;
            if (iVar1 == 4) {
              m_8.cstep = (long)m_8.h * (long)m_8.w;
            }
            p_Var5 = this->_vptr_LSTM_x86_avx[-3];
            if (*(int *)(p_Var5 + 0x38 + (long)&(this->weight_hc_data_packed).data) ==
                *(int *)(p_Var5 + 0x44 + (long)&(this->weight_hc_data_packed).data)) {
              m_9.cstep = 0;
              m_9.data = (void *)0x0;
              m_9.elemsize._0_4_ = 0;
              m_9.elemsize._4_4_ = 0;
              m_9.elempack = 0;
              m_9.allocator = (Allocator *)0x0;
              m_9.dims = 0;
              m_9.w = 0;
              m_9.h = 0;
              m_9.d = 0;
              m_9.c = 0;
            }
            else {
              m_9.w = *(int *)(&this->field_0x1e4 + (long)p_Var5);
              m_9.h = *(int *)(&this->field_0x1e8 + (long)p_Var5);
              uVar6 = *(ulong *)(&this->field_0x1c8 + (long)p_Var5);
              m_9.data = (void *)(*(long *)(&this->field_0x1f8 + (long)p_Var5) * uVar6 +
                                 *(long *)(&this->field_0x1b8 + (long)p_Var5));
              m_9.elempack = *(int *)(&this->field_0x1d0 + (long)p_Var5);
              m_9.allocator = *(Allocator **)(&this->field_0x1d8 + (long)p_Var5);
              m_9.elemsize._0_4_ = (undefined4)uVar6;
              m_9.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
              m_9.c = *(int *)(&this->field_0x1ec + (long)p_Var5);
              m_9.d = 1;
              m_9.dims = *(int *)(&this->field_0x1e0 + (long)p_Var5) + -1;
              m_9.cstep = (uVar6 * (long)m_9.h * (long)m_9.w + 0xf & 0xfffffffffffffff0) / uVar6;
              if (*(int *)(&this->field_0x1e0 + (long)p_Var5) == 4) {
                m_9.cstep = (long)m_9.h * (long)m_9.w;
              }
            }
            m_9.refcount._4_4_ = 0;
            m_9.refcount._0_4_ = 0;
            iVar4 = lstm(bottom_blob,&m_1,1,&m_5,&m_6,&m_8,&m_9,&local_158,&m_4,opt);
            bVar11 = iVar4 == 0;
            if (bVar11) {
              if ((int)_h < 1) {
                iVar4 = 0;
              }
              else {
                iVar4 = 0;
                uVar6 = 0;
                do {
                  pvVar9 = (void *)((long)m_1.w * uVar6 *
                                    CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                   (long)m_1.data);
                  __dest = (void *)((long)this_00->w * uVar6 * this_00->elemsize +
                                   (long)this_00->data);
                  memcpy(__dest,(void *)((long)m.w * uVar6 *
                                         CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                        (long)m.data),
                         (long)*(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x38 +
                                       (long)&(this->weight_hc_data_packed).data) << 2);
                  memcpy((void *)((long)*(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x38 +
                                                (long)&(this->weight_hc_data_packed).data) * 4 +
                                 (long)__dest),pvVar9,
                         (long)*(int *)(this->_vptr_LSTM_x86_avx[-3] + 0x38 +
                                       (long)&(this->weight_hc_data_packed).data) << 2);
                  uVar6 = uVar6 + 1;
                  pvVar10 = local_2d0;
                } while (_h != uVar6);
              }
            }
            piVar2 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  if (m_3.data != (void *)0x0) {
                    free(m_3.data);
                  }
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            bVar11 = false;
          }
          if (m_2.refcount != (int *)0x0) {
            LOCK();
            *m_2.refcount = *m_2.refcount + -1;
            UNLOCK();
            if (*m_2.refcount == 0) {
              if (m_2.allocator == (Allocator *)0x0) {
                if (m_2.data != (void *)0x0) {
                  free(m_2.data);
                }
              }
              else {
                (*(m_2.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar11) goto LAB_00375dda;
    }
    pMVar7 = (pvVar10->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = 0;
    if ((long)(pvVar10->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar7 == 0xd8) {
      if (pMVar7 + 1 != &local_318) {
        piVar2 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = pMVar7[1].refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (pMVar7[1].allocator == (Allocator *)0x0) {
              if (pMVar7[1].data != (void *)0x0) {
                free(pMVar7[1].data);
              }
            }
            else {
              (*(pMVar7[1].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar7[1].data = local_318.data;
        pMVar7[1].refcount = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
        pMVar7[1].elemsize = CONCAT44(local_318.elemsize._4_4_,(undefined4)local_318.elemsize);
        pMVar7[1].elempack = local_318.elempack;
        pMVar7[1].allocator = local_318.allocator;
        pMVar7[1].dims = local_318.dims;
        pMVar7[1].w = local_318.w;
        pMVar7[1].h = local_318.h;
        pMVar7[1].d = local_318.d;
        pMVar7[1].c = local_318.c;
        pMVar7[1].cstep = local_318.cstep;
        pMVar7 = (pvVar10->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      iVar4 = 0;
      if (pMVar7 + 2 != &local_368) {
        piVar2 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = pMVar7[2].refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (pMVar7[2].allocator == (Allocator *)0x0) {
              if (pMVar7[2].data != (void *)0x0) {
                free(pMVar7[2].data);
              }
            }
            else {
              (*(pMVar7[2].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar7[2].data = local_368.data;
        pMVar7[2].refcount = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
        pMVar7[2].elemsize = CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize);
        pMVar7[2].elempack = local_368.elempack;
        pMVar7[2].allocator = local_368.allocator;
        pMVar7[2].dims = local_368.dims;
        pMVar7[2].w = local_368.w;
        pMVar7[2].h = local_368.h;
        pMVar7[2].d = local_368.d;
        pMVar7[2].c = local_368.c;
        pMVar7[2].cstep = local_368.cstep;
      }
    }
  }
LAB_00375dda:
  piVar2 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_368.allocator == (Allocator *)0x0) {
        if (local_368.data != (void *)0x0) {
          free(local_368.data);
        }
      }
      else {
        (*(local_368.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar2 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_318.allocator == (Allocator *)0x0) {
        if (local_318.data != (void *)0x0) {
          free(local_318.data);
        }
      }
      else {
        (*(local_318.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar4;
}

Assistant:

int LSTM_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(hidden_size, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data_packed.channel(0), bias_c_data_packed.channel(0), weight_hc_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data_packed.channel(0), bias_c_data_packed.channel(0), weight_hc_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden0, cell0, opt);
        if (ret0 != 0)
            return ret0;

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data_packed.channel(1), bias_c_data_packed.channel(1), weight_hc_data_packed.channel(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden1, cell1, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}